

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O0

bool __thiscall M7Getter::AddAlgoFrequencies(M7Getter *this,TldDSAsKey *key)

{
  m7_algo_count_t *pmVar1;
  size_t sVar2;
  size_t sVar3;
  m7_algo_count_t *pmVar4;
  reference pp_Var5;
  double local_78;
  value_type local_50;
  m7_algo_count_t *algo_val;
  size_t j;
  double frequency;
  uint uStack_30;
  bool found;
  uint32_t i_1;
  uint32_t i;
  bool is_cc;
  double total;
  TldDSAsKey *pTStack_18;
  bool ret;
  TldDSAsKey *key_local;
  M7Getter *this_local;
  
  total._7_1_ = 1;
  _i = 0.0;
  i_1._3_1_ = key->name_len == 2;
  for (uStack_30 = 0; uStack_30 < key->algo_nb; uStack_30 = uStack_30 + 1) {
    _i = (double)key->algo_count[uStack_30] + _i;
  }
  frequency._4_4_ = 0;
  pTStack_18 = key;
  key_local = (TldDSAsKey *)this;
  do {
    if (pTStack_18->algo_nb <= frequency._4_4_) {
      return (bool)(total._7_1_ & 1);
    }
    frequency._3_1_ = 0;
    j = (size_t)((double)pTStack_18->algo_count[frequency._4_4_] / _i);
    algo_val = (m7_algo_count_t *)0x0;
    while( true ) {
      pmVar1 = algo_val;
      pmVar4 = (m7_algo_count_t *)
               std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::size
                         (&this->algo_count);
      if (pmVar4 <= pmVar1) break;
      pp_Var5 = std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::
                operator[](&this->algo_count,(size_type)algo_val);
      sVar2 = j;
      if ((*pp_Var5)->algo_code == pTStack_18->algo_code[frequency._4_4_]) {
        pp_Var5 = std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::
                  operator[](&this->algo_count,(size_type)algo_val);
        sVar3 = j;
        (*pp_Var5)->algo_frequency = (double)sVar2 + (*pp_Var5)->algo_frequency;
        if ((i_1._3_1_ & 1) != 0) {
          pp_Var5 = std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::
                    operator[](&this->algo_count,(size_type)algo_val);
          (*pp_Var5)->algo_frequency_cc = (double)sVar3 + (*pp_Var5)->algo_frequency_cc;
        }
        frequency._3_1_ = 1;
        break;
      }
      algo_val = (m7_algo_count_t *)((long)&algo_val->algo_code + 1);
    }
    if ((frequency._3_1_ & 1) == 0) {
      local_50 = (value_type)operator_new(0x18);
      local_50->algo_code = pTStack_18->algo_code[frequency._4_4_];
      local_50->algo_frequency = (double)j;
      if ((i_1._3_1_ & 1) == 0) {
        local_78 = 0.0;
      }
      else {
        local_78 = (double)j;
      }
      local_50->algo_frequency_cc = local_78;
      std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::push_back
                (&this->algo_count,&local_50);
    }
    frequency._4_4_ = frequency._4_4_ + 1;
  } while( true );
}

Assistant:

bool M7Getter::AddAlgoFrequencies(TldDSAsKey* key)
{
    bool ret = true;
    double total = 0;
    bool is_cc = (key->name_len == 2);

    for (uint32_t i = 0; i < key->algo_nb; i++) {
        total += key->algo_count[i];
    }
    for (uint32_t i = 0; i < key->algo_nb; i++) {
        bool found = false;
        double frequency = ((double)key->algo_count[i]) / total;
        for (size_t j = 0; j < algo_count.size(); j++) {
            if (algo_count[j]->algo_code == key->algo_code[i]) {
                algo_count[j]->algo_frequency += frequency;
                if (is_cc) {
                    algo_count[j]->algo_frequency_cc += frequency;
                }
                found = true;
                break;
            }
        }
        if (!found) {
            m7_algo_count_t * algo_val = new m7_algo_count_t;
                
            algo_val->algo_code = key->algo_code[i];
            algo_val->algo_frequency = frequency;
            algo_val->algo_frequency_cc = (is_cc) ? frequency : 0.0;
            this->algo_count.push_back(algo_val);
        }
    }

    return ret;
}